

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteElemSegment(WatWriter *this,ElemSegment *segment)

{
  byte bVar1;
  bool bVar2;
  Enum EVar3;
  ElemExprVector *this_00;
  reference pEVar4;
  ElemExpr *expr;
  const_iterator __end2;
  const_iterator __begin2;
  ElemExprVector *__range2;
  undefined1 auStack_28 [7];
  uint8_t flags;
  ElemSegment *local_18;
  ElemSegment *segment_local;
  WatWriter *this_local;
  
  local_18 = segment;
  segment_local = (ElemSegment *)this;
  WriteOpenSpace(this,"elem");
  string_view::string_view((string_view *)auStack_28,&local_18->name);
  WriteNameOrIndex(this,_auStack_28,this->elem_segment_index_,Space);
  bVar1 = ElemSegment::GetFlags(local_18,(this->super_ModuleContext).module);
  if ((bVar1 & 3) == 2) {
    WriteOpenSpace(this,"table");
    WriteVar(this,&local_18->table_var,Space);
    WriteCloseSpace(this);
  }
  if ((bVar1 & 1) == 0) {
    WriteInitExpr(this,&local_18->offset);
  }
  if ((bVar1 & 3) == 3) {
    WritePuts(this,"declare",Space);
  }
  if ((bVar1 & 4) == 0) {
    EVar3 = Type::operator_cast_to_Enum(&local_18->elem_type);
    if (EVar3 != FuncRef) {
      __assert_fail("segment.elem_type == Type::FuncRef",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wat-writer.cc"
                    ,0x528,
                    "void wabt::(anonymous namespace)::WatWriter::WriteElemSegment(const ElemSegment &)"
                   );
    }
    WritePuts(this,"func",Space);
  }
  else {
    WriteType(this,(Type)(local_18->elem_type).enum_,Space);
  }
  this_00 = &local_18->elem_exprs;
  __end2 = std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::begin(this_00);
  expr = (ElemExpr *)std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::end(this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_wabt::ElemExpr_*,_std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>_>
                                *)&expr);
    if (!bVar2) {
      WriteCloseNewline(this);
      this->elem_segment_index_ = this->elem_segment_index_ + 1;
      return;
    }
    pEVar4 = __gnu_cxx::
             __normal_iterator<const_wabt::ElemExpr_*,_std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>_>
             ::operator*(&__end2);
    if ((bVar1 & 4) == 0) {
      if (pEVar4->kind != RefFunc) {
        __assert_fail("expr.kind == ElemExprKind::RefFunc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wat-writer.cc"
                      ,0x538,
                      "void wabt::(anonymous namespace)::WatWriter::WriteElemSegment(const ElemSegment &)"
                     );
      }
      WriteVar(this,&pEVar4->var,Space);
    }
    else if (pEVar4->kind == RefNull) {
      WriteOpenSpace(this,"ref.null");
      WriteRefKind(this,(Type)(pEVar4->type).enum_,Space);
      WriteCloseSpace(this);
    }
    else {
      WriteOpenSpace(this,"ref.func");
      WriteVar(this,&pEVar4->var,Space);
      WriteCloseSpace(this);
    }
    __gnu_cxx::
    __normal_iterator<const_wabt::ElemExpr_*,_std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void WatWriter::WriteElemSegment(const ElemSegment& segment) {
  WriteOpenSpace("elem");
  WriteNameOrIndex(segment.name, elem_segment_index_, NextChar::Space);

  uint8_t flags = segment.GetFlags(&module);

  if ((flags & (SegPassive | SegExplicitIndex)) == SegExplicitIndex) {
    WriteOpenSpace("table");
    WriteVar(segment.table_var, NextChar::Space);
    WriteCloseSpace();
  }

  if (!(flags & SegPassive)) {
    WriteInitExpr(segment.offset);
  }

  if ((flags & SegDeclared) == SegDeclared) {
    WritePuts("declare", NextChar::Space);
  }

  if (flags & SegUseElemExprs) {
    WriteType(segment.elem_type, NextChar::Space);
  } else {
    assert(segment.elem_type == Type::FuncRef);
    WritePuts("func", NextChar::Space);
  }

  for (const ElemExpr& expr : segment.elem_exprs) {
    if (flags & SegUseElemExprs) {
      if (expr.kind == ElemExprKind::RefNull) {
        WriteOpenSpace("ref.null");
        WriteRefKind(expr.type, NextChar::Space);
        WriteCloseSpace();
      } else {
        WriteOpenSpace("ref.func");
        WriteVar(expr.var, NextChar::Space);
        WriteCloseSpace();
      }
    } else {
      assert(expr.kind == ElemExprKind::RefFunc);
      WriteVar(expr.var, NextChar::Space);
    }
  }
  WriteCloseNewline();
  elem_segment_index_++;
}